

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

NodeSequence __thiscall
GraphBuilder::insertFunction(GraphBuilder *this,Function *function,CallInst *callInstruction)

{
  Function *pFVar1;
  Node *node;
  NodeSequence NVar2;
  NodeSequence NVar3;
  
  if (*(Function **)(function + 0x48) == function + 0x48) {
    NVar2 = insertUndefinedFunction(this,function,callInstruction);
  }
  else {
    pFVar1 = llvm::CallBase::getCalledFunction((CallBase *)callInstruction);
    if (pFVar1 == (Function *)0x0) {
      node = &createNode<(NodeType)7,decltype(nullptr),llvm::CallInst_const*>
                        ((void *)0x0,callInstruction)->super_Node;
    }
    else {
      node = &createNode<(NodeType)7,llvm::CallInst_const*>(callInstruction)->super_Node;
    }
    addNode<Node>(this,node);
    NVar3 = createOrGetFunction(this,function);
    NVar2.second = NVar3.second;
    NVar2.first = node;
    Node::addSuccessor(node,NVar3.first);
  }
  return NVar2;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertFunction(const Function *function,
                             const CallInst *callInstruction) {
    if (function->empty()) {
        return insertUndefinedFunction(function, callInstruction);
    }
    Node *callNode;
    if (callInstruction->getCalledFunction()) {
        callNode = createNode<NodeType::CALL>(callInstruction);
    } else {
        callNode = createNode<NodeType::CALL>(nullptr, callInstruction);
    }
    addNode(callNode);
    auto nodeSeq = createOrGetFunction(function);
    callNode->addSuccessor(nodeSeq.first);
    return {callNode, nodeSeq.second};
}